

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

double __thiscall
helics::RandomDropFilterOperation::getProperty(RandomDropFilterOperation *this,string_view property)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  
  __y._M_str = "dropprob";
  __y._M_len = 8;
  bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y);
  if ((!bVar1) &&
     (__y_00._M_str = "prob", __y_00._M_len = 4,
     bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y_00),
     !bVar1)) {
    return -1e+49;
  }
  return (this->dropProb).super___atomic_float<double>._M_fp;
}

Assistant:

double RandomDropFilterOperation::getProperty(std::string_view property)
{
    if ((property == "dropprob") || (property == "prob")) {
        return dropProb.load();
    }
    return FilterOperations::getProperty(property);
}